

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::insert
          (QMovableArrayOps<QByteArray> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  QByteArray *pQVar4;
  long lVar5;
  qsizetype inserts;
  bool bVar6;
  
  data = &((t->d).d)->super_QArrayData;
  pcVar2 = (t->d).ptr;
  qVar3 = (t->d).size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size != 0;
  QArrayDataPointer<QByteArray>::detachAndGrow
            ((QArrayDataPointer<QByteArray> *)this,(uint)(i == 0 && bVar6),n,(QByteArray **)0x0,
             (QArrayDataPointer<QByteArray> *)0x0);
  if (i == 0 && bVar6) {
    if (n != 0) {
      pQVar4 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr;
      do {
        pQVar4[-1].d.d = (Data *)data;
        pQVar4[-1].d.ptr = pcVar2;
        pQVar4[-1].d.size = qVar3;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar4 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   ptr;
        }
        n = n + -1;
        pQVar4 = pQVar4 + -1;
        (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr = pQVar4;
        pqVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                  size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    pQVar4 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr + i;
    memmove(pQVar4 + n,pQVar4,
            ((this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size - i
            ) * 0x18);
    lVar5 = n;
    if (n != 0) {
      do {
        (pQVar4->d).d = (Data *)data;
        (pQVar4->d).ptr = pcVar2;
        (pQVar4->d).size = qVar3;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar5 = lVar5 + -1;
        pQVar4 = pQVar4 + 1;
      } while (lVar5 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
    *pqVar1 = *pqVar1 + n;
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }